

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::IsIn(Var argProperty,Var instance,ScriptContext *scriptContext)

{
  code *pcVar1;
  PropertyRecord *pPVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 index_00;
  IndexType IVar5;
  RecyclableObject *instance_00;
  undefined4 *puVar6;
  Var pvVar7;
  PropertyRecord *pPVar8;
  char *message;
  char *error;
  uint lineNumber;
  undefined1 local_88 [8];
  uint32 index;
  CacheInfoFlag CStack_7c;
  InlineCache *local_78;
  PolymorphicInlineCache *pPStack_70;
  FunctionBody *local_68;
  RecyclableObject *pRStack_60;
  PropertyRecordUsageCache *local_58;
  uint local_50;
  bool local_4b;
  RecyclableObject *local_48;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  PropertyRecord *propertyRecord;
  Var value;
  
  BVar4 = IsObject(instance);
  if (BVar4 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2e,L"in");
  }
  instance_00 = VarTo<Js::RecyclableObject>(instance);
  propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  bVar3 = GetPropertyRecordUsageCache
                    (argProperty,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,&local_48);
  if (bVar3) {
    propertyRecordUsageCache =
         (PropertyRecordUsageCache *)
         (cacheOwner->super_FinalizableObject).super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject;
    if (*(Type *)&(propertyRecordUsageCache->stElemInlineCache).ptr == false) {
      local_88 = (undefined1  [8])0x0;
      index._0_2_ = 0xffff;
      index._2_1_ = '\0';
      index._3_1_ = InlineCacheNoFlags;
      CStack_7c = defaultInfoFlags;
      local_78 = (InlineCache *)0x0;
      pPStack_70 = (PolymorphicInlineCache *)0x0;
      local_68 = (FunctionBody *)0x0;
      pRStack_60 = (RecyclableObject *)0x0;
      local_58 = (PropertyRecordUsageCache *)0x0;
      local_50 = 0xffffffff;
      local_4b = true;
      bVar3 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,true,false>
                        ((PropertyRecordUsageCache *)cacheOwner,instance,instance_00,&propertyRecord
                         ,scriptContext,(PropertyValueInfo *)local_88,local_48,
                         (PropertyCacheOperationInfo *)0x0);
      if (bVar3) {
        bVar3 = VarIs<Js::JavascriptBoolean>(propertyRecord);
        if (bVar3) {
          return propertyRecord;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        error = "(VarIs<JavascriptBoolean>(value))";
        message = "VarIs<JavascriptBoolean>(value)";
        lineNumber = 0x1ecc;
      }
      else {
        BVar4 = GetPropertyWPCache<true,int>
                          (instance,instance_00,
                           *(int *)((cacheOwner->super_FinalizableObject).
                                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1),
                           &propertyRecord,scriptContext,(PropertyValueInfo *)local_88);
        pPVar2 = propertyRecord;
        pPVar8 = (PropertyRecord *)JavascriptBoolean::ToVar(BVar4,scriptContext);
        if (pPVar2 == pPVar8) {
          return propertyRecord;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        error = "(value == JavascriptBoolean::ToVar(result, scriptContext))";
        message = "value == JavascriptBoolean::ToVar(result, scriptContext)";
        lineNumber = 0x1ed0;
      }
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,lineNumber,error,message);
      if (bVar3) {
        *puVar6 = 0;
        return propertyRecord;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    index_00 = PropertyRecord::GetNumericValue((PropertyRecord *)propertyRecordUsageCache);
    local_88._0_4_ = index_00;
  }
  else {
    pvVar7 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(argProperty,scriptContext);
    IVar5 = GetIndexTypeFromPrimitive
                      (pvVar7,scriptContext,(uint32 *)local_88,
                       (PropertyRecord **)&propertyRecordUsageCache,(JavascriptString **)0x0,true,
                       false);
    if (IVar5 != IndexType_Number) {
      BVar4 = HasProperty(instance_00,
                          *(PropertyId *)&(propertyRecordUsageCache->ldElemInlineCache).ptr);
      goto LAB_00abb256;
    }
    index_00 = local_88._0_4_;
  }
  BVar4 = HasItem(instance_00,index_00);
LAB_00abb256:
  pvVar7 = JavascriptBoolean::ToVar(BVar4,scriptContext);
  return pvVar7;
}

Assistant:

Var JavascriptOperators::IsIn(Var argProperty, Var instance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_IsIn);
        // Note that the fact that we haven't seen a given name before doesn't mean that the instance doesn't

        if (!IsObject(instance))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Operand_Invalid_NeedObject, _u("in"));
        }

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        BOOL result;
        PropertyRecord const * propertyRecord = nullptr;
        uint32 index;
        IndexType indexType;

        // Fast path for JavascriptSymbols and PropertyStrings
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (GetPropertyRecordUsageCache(argProperty, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            Var value;
            propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
            if (!propertyRecord->IsNumeric())
            {
                PropertyValueInfo info;
                if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, true /* OutputExistence */, false /* ReturnOperationInfo */>(instance, object, &value, scriptContext, &info, cacheOwner, nullptr))
                {
                    Assert(VarIs<JavascriptBoolean>(value));
                    return value;
                }
                result = JavascriptOperators::GetPropertyWPCache<true /* OutputExistence */>(instance, object, propertyRecordUsageCache->GetPropertyRecord()->GetPropertyId(), &value, scriptContext, &info);
                Assert(value == JavascriptBoolean::ToVar(result, scriptContext));
                return value;
            }

            // We don't cache numeric property lookups, so fall through to the IndexType_Number case
            index = propertyRecord->GetNumericValue();
            indexType = IndexType_Number;
        }
        else
        {
            indexType = GetIndexType(argProperty, scriptContext, &index, &propertyRecord, true);
        }

        if (indexType == IndexType_Number)
        {
            result = JavascriptOperators::HasItem(object, index);
        }
        else
        {
            result = JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());

#ifdef TELEMETRY_JSO
            {
                Assert(indexType != Js::IndexType_JavascriptString);
                if (indexType == Js::IndexType_PropertyId)
                {
                    scriptContext->GetTelemetry().GetOpcodeTelemetry().IsIn(instance, propertyId, result != 0);
                }
            }
#endif
        }
        return JavascriptBoolean::ToVar(result, scriptContext);
        JIT_HELPER_END(Op_IsIn);
    }